

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtensionInfoFromTag
          (ExtensionSet *this,uint32 tag,ExtensionFinder *extension_finder,int *field_number,
          ExtensionInfo *extension)

{
  int iVar1;
  FieldType FVar2;
  bool bVar3;
  
  *field_number = tag >> 3;
  iVar1 = (*extension_finder->_vptr_ExtensionFinder[2])
                    (extension_finder,(ulong)(tag >> 3),extension);
  bVar3 = true;
  if ((char)iVar1 != '\0') {
    if (extension->is_packed == true) {
      bVar3 = (tag & 7) == 2;
    }
    else {
      FVar2 = anon_unknown_0::real_type(extension->type);
      bVar3 = (tag & 7) == *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)FVar2 * 4);
    }
    bVar3 = !bVar3;
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool ExtensionSet::FindExtensionInfoFromTag(
    uint32 tag, ExtensionFinder* extension_finder,
    int* field_number, ExtensionInfo* extension) {
  *field_number = WireFormatLite::GetTagFieldNumber(tag);
  WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

  bool is_unknown;
  if (!extension_finder->Find(*field_number, extension)) {
    is_unknown = true;
  } else if (extension->is_packed) {
    is_unknown = (wire_type != WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
  } else {
    WireFormatLite::WireType expected_wire_type =
        WireFormatLite::WireTypeForFieldType(real_type(extension->type));
    is_unknown = (wire_type != expected_wire_type);
  }
  return !is_unknown;
}